

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

MemFile * memdbFromDbSchema(sqlite3 *db,char *zSchema)

{
  MemStore *pMVar1;
  int iVar2;
  MemFile *pMVar3;
  long in_FS_OFFSET;
  MemFile *p;
  MemFile *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (MemFile *)0x0;
  iVar2 = sqlite3_file_control(db,zSchema,7,&local_18);
  if ((iVar2 == 0) && ((local_18->base).pMethods == &memdb_io_methods)) {
    pMVar1 = local_18->pStore;
    if (pMVar1->pMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(pMVar1->pMutex);
    }
    if (pMVar1->zFName != (char *)0x0) {
      local_18 = (MemFile *)0x0;
    }
    pMVar3 = local_18;
    if (pMVar1->pMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(pMVar1->pMutex);
      pMVar3 = local_18;
    }
  }
  else {
    pMVar3 = (MemFile *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return pMVar3;
}

Assistant:

static MemFile *memdbFromDbSchema(sqlite3 *db, const char *zSchema){
  MemFile *p = 0;
  MemStore *pStore;
  int rc = sqlite3_file_control(db, zSchema, SQLITE_FCNTL_FILE_POINTER, &p);
  if( rc ) return 0;
  if( p->base.pMethods!=&memdb_io_methods ) return 0;
  pStore = p->pStore;
  memdbEnter(pStore);
  if( pStore->zFName!=0 ) p = 0;
  memdbLeave(pStore);
  return p;
}